

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Header.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Minefield_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_Header *this)

{
  ostream *poVar1;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Minefield_Header *local_18;
  Minefield_Header *this_local;
  
  local_18 = this;
  this_local = (Minefield_Header *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Minefield ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_MinefieldID);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Minefield_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Minefield ID:\n"
       << IndentString( m_MinefieldID.GetAsString(), 1 )
       << "\n";

    return ss.str();
}